

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-virt.c
# Opt level: O3

void * mem_alloc(size_t len)

{
  void *pvVar1;
  
  if (len != 0) {
    pvVar1 = malloc(len);
    if (pvVar1 == (void *)0x0) {
      quit("Out of memory!");
      pvVar1 = (void *)0x0;
    }
    return pvVar1;
  }
  return (void *)0x0;
}

Assistant:

void *mem_alloc(size_t len)
{
	/* Note: standard malloc(3) returns a non-null pointer if passed
	 * a length of 0. Not quite sure why Angband's wrapper has this
	 * behavior. */
	if (!len)
		return NULL;

	void *p = malloc(len);
	if (!p)
		quit("Out of memory!");
	return p;
}